

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32
drwav_preinit_write(drwav *pWav,drwav_data_format *pFormat,drwav_bool32 isSequential,
                   drwav_write_proc onWrite,drwav_seek_proc onSeek,void *pUserData,
                   drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_uint32 dVar1;
  drwav_uint32 dVar2;
  drwav_uint32 dVar3;
  _func_void_ptr_size_t_void_ptr *p_Var4;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var5;
  _func_void_void_ptr_void_ptr *p_Var6;
  uint uVar7;
  drwav_bool32 dVar8;
  drwav_bool32 dVar9;
  
  dVar8 = 0;
  dVar9 = 0;
  if ((((onWrite != (drwav_write_proc)0x0 && pWav != (drwav *)0x0) &&
       (dVar9 = dVar8, isSequential != 0 || onSeek != (drwav_seek_proc)0x0)) &&
      (dVar1 = pFormat->format, dVar1 != 2)) && ((dVar1 != 0x11 && (dVar1 != 0xfffe)))) {
    memset(pWav,0,0x1b8);
    pWav->onWrite = onWrite;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    if (pAllocationCallbacks == (drwav_allocation_callbacks *)0x0) {
      (pWav->allocationCallbacks).onMalloc = drwav__malloc_default;
      (pWav->allocationCallbacks).onRealloc = drwav__realloc_default;
      (pWav->allocationCallbacks).onFree = drwav__free_default;
    }
    else {
      p_Var4 = pAllocationCallbacks->onMalloc;
      p_Var5 = pAllocationCallbacks->onRealloc;
      p_Var6 = pAllocationCallbacks->onFree;
      (pWav->allocationCallbacks).pUserData = pAllocationCallbacks->pUserData;
      (pWav->allocationCallbacks).onMalloc = p_Var4;
      (pWav->allocationCallbacks).onRealloc = p_Var5;
      (pWav->allocationCallbacks).onFree = p_Var6;
      if (p_Var6 == (_func_void_void_ptr_void_ptr *)0x0) {
        return 0;
      }
      if (p_Var4 == (_func_void_ptr_size_t_void_ptr *)0x0 &&
          p_Var5 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        return 0;
      }
    }
    (pWav->fmt).formatTag = (drwav_uint16)pFormat->format;
    dVar1 = pFormat->channels;
    (pWav->fmt).channels = (drwav_uint16)dVar1;
    dVar2 = pFormat->sampleRate;
    (pWav->fmt).sampleRate = dVar2;
    dVar3 = pFormat->bitsPerSample;
    uVar7 = dVar1 * dVar3;
    (pWav->fmt).avgBytesPerSec = dVar2 * uVar7 >> 3;
    (pWav->fmt).blockAlign = (drwav_uint16)(uVar7 >> 3);
    (pWav->fmt).bitsPerSample = (drwav_uint16)dVar3;
    (pWav->fmt).extendedSize = 0;
    pWav->isSequentialWrite = isSequential;
    dVar9 = 1;
  }
  return dVar9;
}

Assistant:

static drwav_bool32 drwav_preinit_write(drwav* pWav, const drwav_data_format* pFormat, drwav_bool32 isSequential, drwav_write_proc onWrite, drwav_seek_proc onSeek, void* pUserData, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onWrite == NULL) {
        return DRWAV_FALSE;
    }

    if (!isSequential && onSeek == NULL) {
        return DRWAV_FALSE; /* <-- onSeek is required when in non-sequential mode. */
    }

    /* Not currently supporting compressed formats. Will need to add support for the "fact" chunk before we enable this. */
    if (pFormat->format == DR_WAVE_FORMAT_EXTENSIBLE) {
        return DRWAV_FALSE;
    }
    if (pFormat->format == DR_WAVE_FORMAT_ADPCM || pFormat->format == DR_WAVE_FORMAT_DVI_ADPCM) {
        return DRWAV_FALSE;
    }

    DRWAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onWrite   = onWrite;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pUserData;
    pWav->allocationCallbacks = drwav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);

    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return DRWAV_FALSE;    /* Invalid allocation callbacks. */
    }

    pWav->fmt.formatTag = (drwav_uint16)pFormat->format;
    pWav->fmt.channels = (drwav_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (drwav_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (drwav_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;

    return DRWAV_TRUE;
}